

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

string * decode(string *__return_storage_ptr__,string *stringToDecode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  undefined8 uVar3;
  string_view str;
  int iVar4;
  size_t in_R8;
  string_view encoded_string;
  string_view jsonString;
  json jVar5;
  value_t in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9 [15];
  
  if (stringToDecode->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    str._1_15_ = in_stack_ffffffffffffffc9;
    str._M_len._0_1_ = in_stack_ffffffffffffffc8;
    iVar4 = hasB64Wrapper(str);
    if (iVar4 == 0) {
      pcVar2 = (stringToDecode->_M_dataplus)._M_p;
      if ((*pcVar2 == '\'') || (*pcVar2 == '\"')) {
        jsonString._M_str = (char *)stringToDecode->_M_string_length;
        jsonString._M_len = (size_t)&stack0xffffffffffffffc8;
        jVar5 = helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
        if (in_stack_ffffffffffffffc8 == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&stack0xffffffffffffffc8,jVar5.m_data.m_value.object);
        }
        else {
          helics::fileops::generateJsonString
                    ((string *)__return_storage_ptr__,(json *)&stack0xffffffffffffffc8,true);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&stack0xffffffffffffffc8);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        paVar1 = &stringToDecode->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          uVar3 = *(undefined8 *)((long)&stringToDecode->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = stringToDecode->_M_string_length;
        (stringToDecode->_M_dataplus)._M_p = (pointer)paVar1;
        stringToDecode->_M_string_length = 0;
        (stringToDecode->field_2)._M_local_buf[0] = '\0';
      }
    }
    else {
      if ((stringToDecode->_M_dataplus)._M_p[stringToDecode->_M_string_length - 1] == '\"') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(stringToDecode);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (stringToDecode);
      encoded_string._M_str._0_4_ = iVar4;
      encoded_string._M_len = (size_t)(stringToDecode->_M_dataplus)._M_p;
      encoded_string._M_str._4_4_ = 0;
      gmlc::utilities::base64_decode_to_string_abi_cxx11_
                ((string *)__return_storage_ptr__,(utilities *)stringToDecode->_M_string_length,
                 encoded_string,in_R8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string decode(std::string&& stringToDecode)
{
    if (stringToDecode.empty()) {
        return std::string();
    }
    auto offset = hasB64Wrapper(stringToDecode);
    if (offset != 0) {
        if (stringToDecode.back() == '\"') {
            stringToDecode.pop_back();
        }

        stringToDecode.pop_back();
        return gmlc::utilities::base64_decode_to_string(stringToDecode, offset);
    }

    if ((stringToDecode.front() == '"') || (stringToDecode.front() == '\'')) {
        try {
            return helics::fileops::JsonAsString(helics::fileops::loadJsonStr(stringToDecode));
        }
        catch (const nlohmann::json::exception&) {
            return gmlc::utilities::stringOps::removeQuotes(stringToDecode);
        }
    }
    // move is required since you are returning the rvalue and we want to move from the rvalue input
    return std::move(stringToDecode);
}